

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_tls_connection.cc
# Opt level: O1

void __thiscall AliTlsConnection::Close(AliTlsConnection *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  mbedtls_net_free(&this->server_fd_);
  mbedtls_ssl_free(&this->ssl_);
  mbedtls_ssl_config_free(&this->conf_);
  mbedtls_x509_crt_free(&this->cacert_);
  mbedtls_ctr_drbg_free(&this->ctr_drbg_);
  mbedtls_entropy_free(&this->entropy_);
  (this->super_AliConnection)._vptr_AliConnection = (_func_int **)&PTR_Connect_00193b50;
  pcVar2 = (this->host_)._M_dataplus._M_p;
  paVar1 = &(this->host_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0xb08);
  return;
}

Assistant:

void AliTlsConnection::Close() {
  mbedtls_net_free( &server_fd_ );
  mbedtls_ssl_free( &ssl_ );
  mbedtls_ssl_config_free( &conf_ );
  mbedtls_x509_crt_free( &cacert_ );
  mbedtls_ctr_drbg_free( &ctr_drbg_ );
  mbedtls_entropy_free( &entropy_ );
  delete this;
}